

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_host(ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  void *pvVar1;
  ngx_http_core_srv_conf_t *cscf;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  if ((r->headers_in).server.len == 0) {
    pvVar1 = r->srv_conf[ngx_http_core_module.ctx_index];
    *(uint *)v = *(uint *)v & 0xf0000000 | (uint)*(undefined8 *)((long)pvVar1 + 0x30) & 0xfffffff;
    v->data = *(u_char **)((long)pvVar1 + 0x38);
  }
  else {
    *(uint *)v = *(uint *)v & 0xf0000000 | (uint)(r->headers_in).server.len & 0xfffffff;
    v->data = (r->headers_in).server.data;
  }
  *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
  *(uint *)v = *(uint *)v & 0xdfffffff;
  *(uint *)v = *(uint *)v & 0xbfffffff;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_host(ngx_http_request_t *r, ngx_http_variable_value_t *v,
    uintptr_t data)
{
    ngx_http_core_srv_conf_t  *cscf;

    if (r->headers_in.server.len) {
        v->len = r->headers_in.server.len;
        v->data = r->headers_in.server.data;

    } else {
        cscf = ngx_http_get_module_srv_conf(r, ngx_http_core_module);

        v->len = cscf->server_name.len;
        v->data = cscf->server_name.data;
    }

    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    return NGX_OK;
}